

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O2

genxStatus initCollector(genxWriter w,collector *c)

{
  genxStatus gVar1;
  utf8 puVar2;
  
  c->space = 100;
  puVar2 = (utf8)allocate(w,100);
  c->buf = puVar2;
  if (puVar2 == (utf8)0x0) {
    gVar1 = GENX_ALLOC_FAILED;
  }
  else {
    c->used = 0;
    gVar1 = GENX_SUCCESS;
  }
  return gVar1;
}

Assistant:

static genxStatus initCollector(genxWriter w, collector * c)
{
  c->space = 100;
  if ((c->buf = (utf8) allocate(w, c->space)) == NULL)
    return GENX_ALLOC_FAILED;
  c->used = 0;
  return GENX_SUCCESS;
}